

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

double sptk::AddInLogSpace(double log_x,double log_y)

{
  double in_XMM0_Qa;
  double __x;
  double in_XMM1_Qa;
  double diff;
  double greater;
  double smaller;
  double local_40;
  double local_8;
  
  if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
    local_40 = in_XMM0_Qa;
    if (in_XMM0_Qa < in_XMM1_Qa) {
      local_40 = in_XMM1_Qa;
      in_XMM1_Qa = in_XMM0_Qa;
    }
    if (-34.0 <= in_XMM1_Qa - local_40) {
      __x = exp(in_XMM1_Qa - local_40);
      local_8 = log1p(__x);
      local_8 = local_40 + local_8;
    }
    else {
      local_8 = local_40;
    }
  }
  else {
    local_8 = in_XMM0_Qa + 0.693147180559945;
  }
  return local_8;
}

Assistant:

double AddInLogSpace(double log_x, double log_y) {
  if (log_x == log_y) return log_x + kLogTwo;
  const double smaller((log_x < log_y) ? log_x : log_y);
  const double greater((log_x < log_y) ? log_y : log_x);
  const double diff(smaller - greater);
  if (diff < kThresholdOfInformationLossInLogSpace) return greater;
  return greater + std::log1p(std::exp(diff));
}